

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_event_timer.h
# Opt level: O1

void ngx_event_add_timer(ngx_event_t *ev,ngx_msec_t timer)

{
  ngx_log_t *log;
  ngx_rbtree_key_t nVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  ngx_rbtree_key_t nVar5;
  
  nVar5 = ngx_current_msec + timer;
  if ((ev->field_0x9 & 8) != 0) {
    log = ev->log;
    nVar1 = (ev->timer).key;
    uVar3 = nVar5 - nVar1;
    uVar4 = -uVar3;
    if (0 < (long)uVar3) {
      uVar4 = uVar3;
    }
    cVar2 = (char)log->log_level;
    if (uVar4 < 300) {
      if (-1 < cVar2) {
        return;
      }
      ngx_log_error_core(8,log,0,"event timer: %d, old: %M, new: %M",
                         (ulong)*(uint *)((long)ev->data + 0x18),nVar1,nVar5);
      return;
    }
    if (cVar2 < '\0') {
      ngx_log_error_core(8,log,0,"event timer del: %d: %M",(ulong)*(uint *)((long)ev->data + 0x18));
    }
    ngx_rbtree_delete(&ngx_event_timer_rbtree,&ev->timer);
    (ev->timer).left = (ngx_rbtree_node_t *)0x0;
    (ev->timer).right = (ngx_rbtree_node_t *)0x0;
    (ev->timer).parent = (ngx_rbtree_node_t *)0x0;
    ev->field_0x9 = ev->field_0x9 & 0xf7;
  }
  (ev->timer).key = nVar5;
  if ((ev->log->log_level & 0x80) != 0) {
    ngx_log_error_core(8,ev->log,0,"event timer add: %d: %M:%M",
                       (ulong)*(uint *)((long)ev->data + 0x18),timer,nVar5);
  }
  ngx_rbtree_insert(&ngx_event_timer_rbtree,&ev->timer);
  ev->field_0x9 = ev->field_0x9 | 8;
  return;
}

Assistant:

static ngx_inline void
ngx_event_add_timer(ngx_event_t *ev, ngx_msec_t timer)
{
    ngx_msec_t      key;
    ngx_msec_int_t  diff;

    key = ngx_current_msec + timer;

    if (ev->timer_set) {

        /*
         * Use a previous timer value if difference between it and a new
         * value is less than NGX_TIMER_LAZY_DELAY milliseconds: this allows
         * to minimize the rbtree operations for fast connections.
         */

        diff = (ngx_msec_int_t) (key - ev->timer.key);

        if (ngx_abs(diff) < NGX_TIMER_LAZY_DELAY) {
            ngx_log_debug3(NGX_LOG_DEBUG_EVENT, ev->log, 0,
                           "event timer: %d, old: %M, new: %M",
                            ngx_event_ident(ev->data), ev->timer.key, key);
            return;
        }

        ngx_del_timer(ev);
    }

    ev->timer.key = key;

    ngx_log_debug3(NGX_LOG_DEBUG_EVENT, ev->log, 0,
                   "event timer add: %d: %M:%M",
                    ngx_event_ident(ev->data), timer, ev->timer.key);

    ngx_rbtree_insert(&ngx_event_timer_rbtree, &ev->timer);

    ev->timer_set = 1;
}